

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavMoveRequestResolveWithPastTreeNode
               (ImGuiNavItemData *result,ImGuiTreeNodeStackData *tree_node_data)

{
  ImGuiContext *pIVar1;
  ImGuiID *in_RSI;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  GImGui->NavMoveScoringItems = false;
  (pIVar1->LastItemData).ID = *in_RSI;
  (pIVar1->LastItemData).InFlags = in_RSI[2] & 0xffdfffff;
  (pIVar1->LastItemData).NavRect.Min = *(ImVec2 *)(in_RSI + 3);
  (pIVar1->LastItemData).NavRect.Max = *(ImVec2 *)(in_RSI + 5);
  NavApplyItemToResult((ImGuiNavItemData *)g);
  NavClearPreferredPosForAxis((ImGuiAxis)((ulong)in_RSI >> 0x20));
  NavUpdateAnyRequestFlag();
  return;
}

Assistant:

void ImGui::NavMoveRequestResolveWithPastTreeNode(ImGuiNavItemData* result, ImGuiTreeNodeStackData* tree_node_data)
{
    ImGuiContext& g = *GImGui;
    g.NavMoveScoringItems = false;
    g.LastItemData.ID = tree_node_data->ID;
    g.LastItemData.InFlags = tree_node_data->InFlags & ~ImGuiItemFlags_HasSelectionUserData; // Losing SelectionUserData, recovered next-frame (cheaper).
    g.LastItemData.NavRect = tree_node_data->NavRect;
    NavApplyItemToResult(result); // Result this instead of implementing a NavApplyPastTreeNodeToResult()
    NavClearPreferredPosForAxis(ImGuiAxis_Y);
    NavUpdateAnyRequestFlag();
}